

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.hpp
# Opt level: O0

void __thiscall
pstore::database::database<pstore::file::in_memory>
          (database *this,shared_ptr<pstore::file::in_memory> *file,
          unique_ptr<pstore::system_page_size_interface,_std::default_delete<pstore::system_page_size_interface>_>
          *page_size,
          unique_ptr<pstore::region::factory,_std::default_delete<pstore::region::factory>_>
          *region_factory,bool access_tick_enabled)

{
  element_type *file_00;
  typed_address<pstore::trailer> footer_pos;
  bool access_tick_enabled_local;
  unique_ptr<pstore::region::factory,_std::default_delete<pstore::region::factory>_>
  *region_factory_local;
  unique_ptr<pstore::system_page_size_interface,_std::default_delete<pstore::system_page_size_interface>_>
  *page_size_local;
  shared_ptr<pstore::file::in_memory> *file_local;
  database *this_local;
  
  this->_vptr_database = (_func_int **)&PTR__database_0025c250;
  storage::storage<pstore::file::in_memory>(&this->storage_,file,page_size,region_factory);
  std::shared_ptr<pstore::header>::shared_ptr(&this->header_);
  pstore::file::range_lock::range_lock(&this->range_lock_);
  std::unique_lock<pstore::file::range_lock>::unique_lock(&this->lock_);
  this->vacuum_mode_ = disabled;
  this->modified_ = false;
  this->closed_ = false;
  file_00 = std::
            __shared_ptr_access<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator*((__shared_ptr_access<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)file);
  footer_pos = get_footer_pos<pstore::file::in_memory>(file_00);
  sizes::sizes(&this->size_,footer_pos);
  std::array<std::shared_ptr<pstore::index::index_base>,_6UL>::array(&this->indices_);
  std::__cxx11::string::string((string *)&this->sync_name_);
  finish_init(this,access_tick_enabled);
  return;
}

Assistant:

database::database (std::shared_ptr<File> const & file,
                        std::unique_ptr<system_page_size_interface> && page_size,
                        std::unique_ptr<region::factory> && region_factory,
                        bool const access_tick_enabled)
            : storage_{file, std::move (page_size), std::move (region_factory)}
            , size_{database::get_footer_pos (*file)} {

        this->finish_init (access_tick_enabled);
    }